

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O0

void __thiscall Refal2::CQualifierParser::addQualifier(CQualifierParser *this)

{
  bool bVar1;
  undefined1 local_58 [8];
  CQualifier qualifier;
  CQualifierParser *this_local;
  
  qualifier.numbers.elements = (uint *)this;
  CQualifier::CQualifier((CQualifier *)local_58);
  bVar1 = CModuleBuilder::GetNamedQualifier
                    (&this->super_CModuleBuilder,&this->token,(CQualifier *)local_58);
  if (bVar1) {
    CQualifierBuilder::AddQualifier(&this->builder,(CQualifier *)local_58);
    this->afterRightParen = false;
  }
  else {
    CParsingElementState::SetWrong(&this->super_CParsingElementState);
  }
  CQualifier::~CQualifier((CQualifier *)local_58);
  return;
}

Assistant:

void CQualifierParser::addQualifier()
{
	CQualifier qualifier;
	if( CModuleBuilder::GetNamedQualifier( token, qualifier ) ) {
		builder.AddQualifier( qualifier );
		afterRightParen = false;
	} else {
		SetWrong();
	}
}